

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O3

uint32_t MMFW_EntryLength(MMFWEntry *entry)

{
  MMFWKind MVar1;
  uint32_t uVar2;
  
  MVar1 = entry->kind;
  if ((MVar1 == MMFW_KIND_FILMS) || (MVar1 == MMFW_KIND_PICTURES)) {
    uVar2 = ((entry->entry).picture)->length;
  }
  else {
    uVar2 = 0;
    if (MVar1 == MMFW_KIND_SOUNDS) {
      return ((entry->entry).sound)->length;
    }
  }
  return uVar2;
}

Assistant:

uint32_t
MMFW_EntryLength(const MMFWEntry *entry)
{
	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		return entry->entry.sound->length;
		break;
	case MMFW_KIND_PICTURES:
		return entry->entry.picture->length;
		break;
	case MMFW_KIND_FILMS:
		return entry->entry.film->length;
		break;
	default:
		return 0; /* XXX NOTREACHED */
	}
}